

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O2

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::start_new_instance
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          ComputationGraph *cg,vector<int,_std::allocator<int>_> *ctx)

{
  LSTMBuilder *pLVar1;
  pointer pEVar2;
  pointer piVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint s;
  ulong uVar8;
  uint i;
  uint i_1;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  initializer_list<dynet::expr::Expression> __l;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> ctx_embed;
  allocator_type local_b1;
  vector<int,_std::allocator<int>_> *local_b0;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> src_fwd;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> src_bwd;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> source_embeddings;
  _Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_58;
  Expression local_40;
  undefined1 extraout_var [56];
  
  uVar5 = (ulong)((long)(source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  this->slen = (uint)uVar5;
  source_embeddings.
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  source_embeddings.
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  source_embeddings.
  super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = ctx;
  if (this->rnn_src_embeddings == false) {
    for (uVar8 = 0; uVar8 < (uVar5 & 0xffffffff); uVar8 = uVar8 + 1) {
      dynet::expr::lookup(&ctx_embed,cg,*(undefined8 *)this,*(undefined8 *)&this->field_0x8,
                          (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar8]);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
      emplace_back<dynet::expr::Expression>(&source_embeddings,(Expression *)&ctx_embed);
      uVar5 = (ulong)this->slen;
    }
  }
  else {
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              (&src_fwd,uVar5 & 0xffffffff,(allocator_type *)&ctx_embed);
    pLVar1 = &this->builder_src_fwd;
    RNNBuilder::new_graph((RNNBuilder *)pLVar1,cg);
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    RNNBuilder::start_new_sequence((RNNBuilder *)pLVar1,&ctx_embed);
    std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
    ~_Vector_base(&ctx_embed.
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 );
    lVar7 = 8;
    for (uVar5 = 0; uVar5 < this->slen; uVar5 = uVar5 + 1) {
      dynet::expr::lookup(&src_bwd,cg,*(undefined8 *)this,*(undefined8 *)&this->field_0x8,
                          (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
      RNNBuilder::add_input((RNNBuilder *)&ctx_embed,(Expression *)pLVar1);
      *(pointer *)
       ((long)src_fwd.
              super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar7 + -8) =
           ctx_embed.
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
      *(uint *)((long)&(src_fwd.
                        super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->pg + lVar7) =
           (uint)ctx_embed.
                 super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + 0x10;
    }
    std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
              (&src_bwd,(ulong)this->slen,(allocator_type *)&ctx_embed);
    pLVar1 = &this->builder_src_bwd;
    RNNBuilder::new_graph((RNNBuilder *)pLVar1,cg);
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    RNNBuilder::start_new_sequence((RNNBuilder *)pLVar1,&ctx_embed);
    std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
    ~_Vector_base(&ctx_embed.
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 );
    uVar4 = this->slen;
    while( true ) {
      uVar4 = uVar4 - 1;
      if ((int)uVar4 < 0) break;
      uVar6 = uVar4 & 0x7fffffff;
      dynet::expr::lookup(&local_58,cg,*(undefined8 *)this,*(undefined8 *)&this->field_0x8,
                          (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar6]);
      RNNBuilder::add_input((RNNBuilder *)&ctx_embed,(Expression *)pLVar1);
      src_bwd.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar6].pg =
           (ComputationGraph *)
           ctx_embed.
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
      src_bwd.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar6].i.t =
           (uint)ctx_embed.
                 super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    lVar7 = 8;
    for (uVar5 = 0; uVar5 < this->slen; uVar5 = uVar5 + 1) {
      ctx_embed.
      super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)src_fwd.
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
      ctx_embed.
      super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(ctx_embed.
                             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             *(undefined4 *)
                              ((long)&(src_fwd.
                                       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->pg + lVar7));
      ctx_embed.
      super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)src_bwd.
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
      __l._M_len = 2;
      __l._M_array = (iterator)&ctx_embed;
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 &local_58,__l,&local_b1);
      expr::detail::
      f<dynet::Concatenate,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((detail *)&local_40,
                 (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 &local_58);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
      emplace_back<dynet::expr::Expression>(&source_embeddings,&local_40);
      std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
      ~_Vector_base(&local_58);
      lVar7 = lVar7 + 0x10;
    }
    std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
    ~_Vector_base(&src_bwd.
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 );
    std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
    ~_Vector_base(&src_fwd.
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 );
  }
  expr::detail::
  f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((detail *)&ctx_embed,&source_embeddings);
  (this->src).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->src).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dynet::expr::parameter(&ctx_embed,cg,*(undefined8 *)&this->p_R,*(undefined8 *)&this->field_0x28);
  (this->i_R).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->i_R).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dynet::expr::parameter(&ctx_embed,cg,*(undefined8 *)&this->p_Q,*(undefined8 *)&this->field_0x38);
  (this->i_Q).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->i_Q).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dynet::expr::parameter(&ctx_embed,cg,*(undefined8 *)&this->p_P,*(undefined8 *)&this->field_0x48);
  (this->i_P).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->i_P).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dynet::expr::parameter
            (&ctx_embed,cg,*(undefined8 *)&this->p_bias,*(undefined8 *)&this->field_0x68);
  (this->i_bias).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->i_bias).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dynet::expr::parameter(&ctx_embed,cg,*(undefined8 *)&this->p_Wa,*(undefined8 *)&this->field_0x78);
  (this->i_Wa).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->i_Wa).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dynet::expr::parameter(&ctx_embed,cg,*(undefined8 *)&this->p_Ua,*(undefined8 *)&this->field_0xa0);
  (this->i_Ua).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->i_Ua).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dynet::expr::parameter(&ctx_embed,cg,*(undefined8 *)&this->p_va,*(undefined8 *)&this->field_0xb0);
  (this->i_va).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->i_va).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dynet::expr::operator*((Expression *)&ctx_embed,&this->i_Ua);
  (this->i_uax).pg =
       (ComputationGraph *)
       ctx_embed.
       super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->i_uax).i.t =
       (uint)ctx_embed.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  this->num_aux_vecs = 0;
  uVar4 = (uint)cg;
  if (((this->giza_fertility != false) || (this->giza_markov != false)) ||
     (this->giza_positional == true)) {
    auVar11._0_8_ =
         dynet::expr::parameter
                   (&ctx_embed,cg,*(undefined8 *)&this->p_Ta,*(undefined8 *)&this->field_0xc0);
    auVar11._8_56_ = extraout_var;
    auVar10 = auVar11._0_16_;
    (this->i_Ta).pg =
         (ComputationGraph *)
         ctx_embed.
         super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->i_Ta).i.t =
         (uint)ctx_embed.
               super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (this->giza_positional == true) {
      uVar6 = this->slen;
      auxiliary_vector(this);
      arange((ComputationGraph *)&ctx_embed,uVar4,0,SUB41(uVar6,0),
             (vector<float,_std::allocator<float>_> *)0x1);
      (this->i_src_idx).pg =
           (ComputationGraph *)
           ctx_embed.
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (this->i_src_idx).i.t =
           (uint)ctx_embed.
                 super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = this->slen;
      auxiliary_vector(this);
      auVar10 = vcvtusi2sd_avx512f(auVar10,uVar6);
      dVar9 = log(auVar10._0_8_ + 1.0);
      repeat((ComputationGraph *)&ctx_embed,uVar4,(float)dVar9,
             (vector<float,_std::allocator<float>_> *)(ulong)uVar6);
      (this->i_src_len).pg =
           (ComputationGraph *)
           ctx_embed.
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (this->i_src_len).i.t =
           (uint)ctx_embed.
                 super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  pEVar2 = (this->aligns).
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->aligns).
      super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar2) {
    (this->aligns).
    super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar2;
  }
  uVar6 = this->slen;
  auxiliary_vector(this);
  repeat((ComputationGraph *)&ctx_embed,uVar4,0.0,
         (vector<float,_std::allocator<float>_> *)(ulong)uVar6);
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
  emplace_back<dynet::expr::Expression>(&this->aligns,(Expression *)&ctx_embed);
  RNNBuilder::new_graph((RNNBuilder *)&this->builder,cg);
  ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  RNNBuilder::start_new_sequence((RNNBuilder *)&this->builder,&ctx_embed);
  std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
  ~_Vector_base(&ctx_embed.
                 super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
               );
  if ((local_b0 == (vector<int,_std::allocator<int>_> *)0x0) || (this->doc_context == false)) {
    this->has_document_context = false;
  }
  else {
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ctx_embed.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this->rnn_src_embeddings == false) {
      uVar5 = 1;
      while( true ) {
        uVar8 = (ulong)((int)uVar5 + 1);
        piVar3 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar8) break;
        dynet::expr::lookup((Expression *)&src_fwd,cg,*(undefined8 *)this,
                            *(undefined8 *)&this->field_0x8,piVar3[uVar5]);
        std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
        emplace_back<dynet::expr::Expression>(&ctx_embed,(Expression *)&src_fwd);
        uVar5 = uVar8;
      }
    }
    else {
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::resize
                (&ctx_embed,
                 ((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2) - 1);
      src_fwd.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      src_fwd.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      src_fwd.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      RNNBuilder::start_new_sequence((RNNBuilder *)&this->builder_src_fwd,&src_fwd);
      std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
      ~_Vector_base((_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                     *)&src_fwd);
      uVar4 = 0;
      while( true ) {
        piVar3 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <=
            (ulong)(uVar4 + 1)) break;
        dynet::expr::lookup(&src_bwd,cg,*(undefined8 *)this,*(undefined8 *)&this->field_0x8,
                            piVar3[uVar4]);
        RNNBuilder::add_input((RNNBuilder *)&src_fwd,(Expression *)&this->builder_src_fwd);
        ctx_embed.
        super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar4].pg =
             (ComputationGraph *)
             src_fwd.
             super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
        ctx_embed.
        super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar4].i.t =
             (uint)src_fwd.
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar4 = uVar4 + 1;
      }
    }
    expr::detail::
    f<dynet::Average,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((detail *)&src_fwd,&source_embeddings);
    dynet::expr::parameter(&src_bwd,cg,*(undefined8 *)&this->p_S,*(undefined8 *)&this->field_0x58);
    (this->i_S).pg =
         (ComputationGraph *)
         src_bwd.
         super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->i_S).i.t =
         (uint)src_bwd.
               super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    dynet::expr::operator*((Expression *)&src_bwd,&this->i_S);
    (this->i_tt_ctx).pg =
         (ComputationGraph *)
         src_bwd.
         super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->i_tt_ctx).i.t =
         (uint)src_bwd.
               super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    this->has_document_context = true;
    std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
    ~_Vector_base(&ctx_embed.
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                 );
  }
  std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
  ~_Vector_base(&source_embeddings.
                 super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
               );
  return;
}

Assistant:

void AttentionalModel<Builder>::start_new_instance(const std::vector<int> &source, ComputationGraph &cg, const std::vector<int> *ctx)
{
    //slen = source.size() - 1; 
    slen = source.size(); 
    std::vector<Expression> source_embeddings;
    if (!rnn_src_embeddings) {
	for (unsigned s = 0; s < slen; ++s) 
	    source_embeddings.push_back(lookup(cg, p_cs, source[s]));
    } else {
	// run a RNN backward and forward over the source sentence
	// and stack the top-level hidden states from each model as 
	// the representation at each position
	std::vector<Expression> src_fwd(slen);
	builder_src_fwd.new_graph(cg);
	builder_src_fwd.start_new_sequence();
	for (unsigned i = 0; i < slen; ++i) 
	    src_fwd[i] = builder_src_fwd.add_input(lookup(cg, p_cs, source[i]));

	std::vector<Expression> src_bwd(slen);
	builder_src_bwd.new_graph(cg);
	builder_src_bwd.start_new_sequence();
	for (int i = slen-1; i >= 0; --i) {
	    // offset by one position to the right, to catch </s> and generally
	    // not duplicate the w_t already captured in src_fwd[t]
	    src_bwd[i] = builder_src_bwd.add_input(lookup(cg, p_cs, source[i]));
	}

	for (unsigned i = 0; i < slen; ++i) 
	    source_embeddings.push_back(concatenate(std::vector<Expression>({src_fwd[i], src_bwd[i]})));
    }
    src = concatenate_cols(source_embeddings); 

    // now for the target sentence
    i_R = parameter(cg, p_R); // hidden -> word rep parameter
    i_Q = parameter(cg, p_Q);
    i_P = parameter(cg, p_P);
    i_bias = parameter(cg, p_bias);  // word bias
    i_Wa = parameter(cg, p_Wa); 
    i_Ua = parameter(cg, p_Ua);
    i_va = parameter(cg, p_va);
    i_uax = i_Ua * src; 

    // reset aux_vecs counter, allowing the memory to be reused
    num_aux_vecs = 0;

    if (giza_fertility || giza_markov || giza_positional) {
	i_Ta = parameter(cg, p_Ta);   
        if (giza_positional) {
            i_src_idx = arange(cg, 0, slen, true, auxiliary_vector());
            i_src_len = repeat(cg, slen, log(1.0 + slen), auxiliary_vector());
        }
    }

    aligns.clear();
    aligns.push_back(repeat(cg, slen, 0.0f, auxiliary_vector()));

    // initialilse h from global information of the source sentence
#ifndef RNN_H0_IS_ZERO
    std::vector<Expression> h0;
    Expression i_src = average(source_embeddings); // try max instead?
    int hidden_layers = builder.num_h0_components();
    for (int l = 0; l < hidden_layers; ++l) {
	Expression i_Wh0 = parameter(cg, p_Wh0[l]);
	h0.push_back(tanh(i_Wh0 * i_src));
    }
    builder.new_graph(cg); 
    builder.start_new_sequence(h0);
#else
    builder.new_graph(cg); 
    builder.start_new_sequence();
#endif

    // document context; n.b. use "0" context for the first sentence
    if (doc_context && ctx != 0) { 
        const std::vector<int> &context = *ctx;

        std::vector<Expression> ctx_embed;
        if (!rnn_src_embeddings) {
            for (unsigned s = 1; s+1 < context.size(); ++s) 
                ctx_embed.push_back(lookup(cg, p_cs, context[s]));
        } else {
            ctx_embed.resize(context.size()-1);
            builder_src_fwd.start_new_sequence();
            for (unsigned i = 0; i+1 < context.size(); ++i) 
                ctx_embed[i] = builder_src_fwd.add_input(lookup(cg, p_cs, context[i]));
        }
        Expression avg_context = average(source_embeddings); 
        i_S = parameter(cg, p_S);
        i_tt_ctx = i_S * avg_context;
        has_document_context = true;
    } else {
        has_document_context = false;
    }
}